

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

bool __thiscall Board::load(Board *this,string *path)

{
  pointer *ppTVar1;
  Tile TVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  char cVar4;
  long lVar5;
  bool bVar6;
  vector<Tile,_std::allocator<Tile>_> tiles;
  string buffer;
  regex nonNumeric;
  ifstream stream;
  Tile local_2a0;
  vector<Tile,_std::allocator<Tile>_> local_298;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  long local_270;
  char local_268;
  undefined7 uStack_267;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)path,_S_in);
  local_278._M_current = &local_268;
  local_270 = 0;
  local_268 = '\0';
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::seekg((long)local_238,_S_beg);
    cVar4 = std::istream::tellg();
    std::__cxx11::string::resize((ulong)&local_278,cVar4);
    std::istream::seekg(local_238,0,0);
    std::istream::read((char *)local_238,(long)local_278._M_current);
    std::ifstream::close();
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_258,"[^0-9]",0x10);
    ppTVar1 = &local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
    _M_finish = (Tile *)0x0;
    local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((ulong)local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppTVar1;
    std::
    __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_298,
               local_278,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_278._M_current + local_270),&local_258,"",0,0);
    std::__cxx11::string::operator=((string *)&local_278,(string *)&local_298);
    if (local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)ppTVar1) {
      operator_delete(local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)((long)&(local_298.super__Vector_base<Tile,_std::allocator<Tile>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage)->value + 1)
                     );
    }
    _Var3._M_current = local_278._M_current;
    bVar6 = local_270 == 0x51;
    if (bVar6) {
      local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
      _M_finish = (Tile *)0x0;
      local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (Tile *)0x0;
      lVar5 = 0;
      do {
        local_2a0.value = (int)_Var3._M_current[lVar5] - 0x30;
        local_2a0.status = (TileStatus)(local_2a0.value != Empty);
        if (local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Tile,std::allocator<Tile>>::_M_realloc_insert<Tile_const&>
                    ((vector<Tile,std::allocator<Tile>> *)&local_298,
                     (iterator)
                     local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2a0);
        }
        else {
          TVar2.status._0_1_ = local_2a0.value != Empty;
          TVar2.value = local_2a0.value;
          TVar2.status._1_3_ = 0;
          *local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data
           ._M_finish = TVar2;
          local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x51);
      std::vector<Tile,_std::allocator<Tile>_>::operator=(&this->_tiles,&local_298);
      if (local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_298.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_258);
    if (local_278._M_current != &local_268) {
      operator_delete(local_278._M_current,CONCAT71(uStack_267,local_268) + 1);
    }
  }
  else {
    bVar6 = false;
  }
  std::ifstream::~ifstream(local_238);
  return bVar6;
}

Assistant:

bool Board::load(const std::string &path)
{
	std::ifstream stream(path);
	std::string buffer;

	if (!stream)
		return false;

	stream.seekg(0, std::ios::end);
	buffer.resize(stream.tellg());
	stream.seekg(0);
	stream.read(&buffer[0], buffer.size());
	stream.close();

	std::regex nonNumeric("[^0-9]");

	buffer = std::regex_replace(buffer, nonNumeric, "");

	if (buffer.size() != 81)
		return false;

	std::vector<Tile> tiles;

	for (auto &c : buffer)
	{
		auto t = Tile{};
		t.value = (TileValue)(c - '0');

		if (t.value == TileValue::Empty)
			t.status = TileStatus::Empty;
		else
			t.status = TileStatus::Solved;

		tiles.push_back(t);
	}

	_tiles = tiles;
	return true;
}